

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaskPool.h
# Opt level: O1

Task * __thiscall
depspawn::internal::TaskPool::
build_task<std::function<void(int&)>const&,std::reference_wrapper<int>>
          (TaskPool *this,Workitem *ctx,function<void_(int_&)> *f,reference_wrapper<int> *args)

{
  Task *this_00;
  _Any_data local_50;
  _Manager_type local_40;
  _Head_base<0UL,_std::reference_wrapper<int>,_false> local_30;
  
  std::function<void_(int_&)>::function((function<void_(int_&)> *)&local_50,f);
  local_30._M_head_impl._M_data = (reference_wrapper<int>)args->_M_data;
  this_00 = LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::intl_malloc
                      (&this->task_pool_);
  std::function<void()>::
  function<std::_Bind<std::function<void(int&)>(std::reference_wrapper<int>)>,void>
            ((function<void()> *)this_00,
             (_Bind<std::function<void_(int_&)>_(std::reference_wrapper<int>)> *)&local_50);
  this_00->ctx_ = ctx;
  this_00->next = (Task *)this;
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return this_00;
}

Assistant:

Task *build_task(Workitem *ctx, F&& f, Args&&... args)
  {
    return task_pool_.malloc(this, ctx, std::bind(std::forward<F>(f), std::forward<Args>(args)...));
  }